

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O1

void F3DAudioCalculate(uint8_t *Instance,F3DAUDIO_LISTENER *pListener,F3DAUDIO_EMITTER *pEmitter,
                      uint32_t Flags,F3DAUDIO_DSP_SETTINGS *pDSPSettings)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  uint uVar14;
  float *pMatrixCoefficients;
  F3DAUDIO_DISTANCE_CURVE_POINT *pFVar15;
  F3DAUDIO_CONE *pFVar16;
  float *pfVar17;
  long lVar18;
  ulong uVar19;
  F3DAUDIO_DISTANCE_CURVE *pFVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  F3DAUDIO_VECTOR channelPosition;
  F3DAUDIO_VECTOR channelPosition_00;
  float local_12c;
  float local_118;
  ConfigInfo *local_110;
  F3DAUDIO_BASIS local_90;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar2 = (pListener->Position).x;
  uVar8 = (pListener->Position).y;
  uVar3 = (pEmitter->Position).x;
  uVar9 = (pEmitter->Position).y;
  fVar33 = (float)uVar2 - (float)uVar3;
  fVar37 = (float)uVar8 - (float)uVar9;
  fVar39 = (pListener->Position).z - (pEmitter->Position).z;
  fVar24 = (float)SDL_sqrtf(fVar39 * fVar39 + fVar33 * fVar33 + fVar37 * fVar37);
  pDSPSettings->EmitterToListenerDistance = fVar24;
  fVar41 = fVar24 / pEmitter->CurveDistanceScaler;
  if ((Flags & 1) != 0) {
    uVar23 = pDSPSettings->SrcChannelCount;
    uVar14 = pDSPSettings->DstChannelCount;
    pMatrixCoefficients = pDSPSettings->pMatrixCoefficients;
    local_110 = (ConfigInfo *)0x0;
    lVar18 = 0;
    do {
      if (*(int *)((long)&kSpeakersConfigInfo[0].configMask + lVar18) == *(int *)Instance) {
        local_110 = (ConfigInfo *)((long)&kSpeakersConfigInfo[0].configMask + lVar18);
        break;
      }
      lVar18 = lVar18 + 0x18;
    } while (lVar18 != 0xf0);
    pFVar20 = pEmitter->pVolumeCurve;
    if (pFVar20 == (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      local_12c = 1.0;
      if (1.0 <= fVar41) {
        local_12c = 1.0 / fVar41;
      }
    }
    else {
      pFVar15 = pFVar20->pPoints;
      uVar21 = (ulong)pFVar20->PointCount;
      uVar19 = 1;
      uVar22 = uVar19;
      if (1 < uVar21) {
        do {
          uVar22 = uVar19;
          if (fVar41 < pFVar15[uVar19].Distance) break;
          uVar19 = uVar19 + 1;
          uVar22 = uVar21;
        } while (uVar21 != uVar19);
      }
      if (uVar22 == uVar21) {
        local_12c = pFVar15[pFVar20->PointCount - 1].DSPSetting;
      }
      else {
        fVar36 = (pFVar15[uVar22].Distance - fVar41) /
                 (pFVar15[uVar22].Distance - pFVar15[uVar22 - 1].Distance);
        local_12c = (1.0 - fVar36) * pFVar15[uVar22].DSPSetting +
                    fVar36 * pFVar15[uVar22 - 1].DSPSetting;
      }
    }
    pFVar20 = pEmitter->pLFECurve;
    if (pFVar20 == (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      local_118 = 1.0;
      if (1.0 <= fVar41) {
        local_118 = 1.0 / fVar41;
      }
    }
    else {
      pFVar15 = pFVar20->pPoints;
      uVar21 = (ulong)pFVar20->PointCount;
      uVar19 = 1;
      uVar22 = uVar19;
      if (1 < uVar21) {
        do {
          uVar22 = uVar19;
          if (fVar41 < pFVar15[uVar19].Distance) break;
          uVar19 = uVar19 + 1;
          uVar22 = uVar21;
        } while (uVar21 != uVar19);
      }
      if (uVar22 == uVar21) {
        local_118 = pFVar15[pFVar20->PointCount - 1].DSPSetting;
      }
      else {
        fVar36 = (pFVar15[uVar22].Distance - fVar41) /
                 (pFVar15[uVar22].Distance - pFVar15[uVar22 - 1].Distance);
        local_118 = (1.0 - fVar36) * pFVar15[uVar22].DSPSetting +
                    fVar36 * pFVar15[uVar22 - 1].DSPSetting;
      }
    }
    if (pListener->pCone != (F3DAUDIO_CONE *)0x0) {
      fVar25 = (float)SDL_acosf(((pListener->OrientFront).z * fVar39 +
                                (pListener->OrientFront).x * fVar33 +
                                (pListener->OrientFront).y * fVar37) / fVar24);
      pFVar16 = pListener->pCone;
      fVar36 = pFVar16->InnerAngle;
      fVar35 = pFVar16->OuterAngle;
      fVar40 = pFVar16->InnerVolume;
      fVar1 = pFVar16->OuterVolume;
      if (((((fVar36 != 0.0) || (NAN(fVar36))) || (fVar35 != 0.0)) || (fVar34 = fVar1, NAN(fVar35)))
         && ((((fVar34 = fVar40, fVar36 != 6.2831855 || (NAN(fVar36))) ||
              ((fVar35 != 6.2831855 || (NAN(fVar35))))) && (1e-07 < fVar24)))) {
        fVar25 = -fVar25;
        fVar36 = fVar36 * 0.5;
        if ((fVar36 < fVar25) && (fVar34 = fVar1, fVar25 <= fVar35 * 0.5)) {
          fVar36 = (fVar25 - fVar36) / (fVar35 * 0.5 - fVar36);
          fVar34 = fVar1 * fVar36 + (1.0 - fVar36) * fVar40;
        }
      }
      local_12c = local_12c * fVar34;
      local_118 = local_118 * fVar34;
    }
    if ((pEmitter->pCone != (F3DAUDIO_CONE *)0x0) && (pEmitter->ChannelCount == 1)) {
      fVar25 = (float)SDL_acosf(((pEmitter->OrientFront).z * fVar39 +
                                (pEmitter->OrientFront).x * fVar33 +
                                (pEmitter->OrientFront).y * fVar37) / fVar24);
      pFVar16 = pEmitter->pCone;
      fVar36 = pFVar16->InnerAngle;
      fVar35 = pFVar16->OuterAngle;
      fVar40 = pFVar16->InnerVolume;
      fVar1 = pFVar16->OuterVolume;
      if (((fVar36 != 0.0) || (((NAN(fVar36) || (fVar35 != 0.0)) || (fVar34 = fVar1, NAN(fVar35)))))
         && (((((fVar34 = fVar40, fVar36 != 6.2831855 || (NAN(fVar36))) || (fVar35 != 6.2831855)) ||
              (NAN(fVar35))) &&
             (((1e-07 < fVar24 && (fVar36 = fVar36 * 0.5, fVar36 < fVar25)) &&
              (fVar34 = fVar1, fVar25 <= fVar35 * 0.5)))))) {
        fVar36 = (fVar25 - fVar36) / (fVar35 * 0.5 - fVar36);
        fVar34 = fVar1 * fVar36 + (1.0 - fVar36) * fVar40;
      }
      local_12c = local_12c * fVar34;
    }
    SDL_memset(pMatrixCoefficients,0,(ulong)uVar23 * (ulong)uVar14 * 4);
    if ((ulong)uVar14 == 1) {
      uVar23 = pEmitter->ChannelCount;
      if ((ulong)uVar23 != 0) {
        pfVar17 = pEmitter->pChannelAzimuths;
        uVar22 = 0;
        do {
          if (((pfVar17 == (float *)0x0) || (fVar36 = pfVar17[uVar22], fVar36 != 6.2831855)) ||
             (NAN(fVar36))) {
            pMatrixCoefficients[uVar22] = local_12c;
          }
          uVar22 = uVar22 + 1;
        } while (uVar23 != uVar22);
      }
    }
    else {
      local_90.front.z = (pListener->OrientFront).z;
      local_90.front.x = (pListener->OrientFront).x;
      local_90.front.y = (pListener->OrientFront).y;
      fVar36 = (pListener->OrientFront).x;
      fVar35 = (pListener->OrientTop).x;
      uVar4 = (pListener->OrientTop).y;
      uVar10 = (pListener->OrientTop).z;
      uVar5 = (pListener->OrientFront).y;
      uVar11 = (pListener->OrientFront).z;
      local_90.right.z = fVar35 * (float)uVar5 - fVar36 * (float)uVar4;
      local_90.right.y = fVar36 * (float)uVar10 - fVar35 * (float)uVar11;
      local_90.right.x = (float)uVar11 * (float)uVar4 - (float)uVar10 * (float)uVar5;
      local_90.top.z = (pListener->OrientTop).z;
      local_90.top.x = (pListener->OrientTop).x;
      local_90.top.y = (pListener->OrientTop).y;
      uVar23 = pEmitter->ChannelCount;
      uVar22 = (ulong)uVar23;
      if (uVar23 == 1) {
        channelPosition.z = -fVar39;
        uVar22 = CONCAT44(fVar37,fVar33) ^ 0x8000000080000000;
        channelPosition.x = (float)(int)uVar22;
        channelPosition.y = (float)(int)(uVar22 >> 0x20);
        ComputeEmitterChannelCoefficients
                  (local_110,&local_90,pEmitter->InnerRadius,channelPosition,local_12c,local_118,
                   Flags,0,1,pMatrixCoefficients);
      }
      else if (uVar23 != 0) {
        fVar36 = (pEmitter->OrientFront).x;
        fVar35 = (pEmitter->OrientTop).x;
        uVar6 = (pEmitter->OrientTop).y;
        uVar12 = (pEmitter->OrientTop).z;
        uVar7 = (pEmitter->OrientFront).y;
        uVar13 = (pEmitter->OrientFront).z;
        local_68 = (float)uVar13 * (float)uVar6 - (float)uVar12 * (float)uVar7;
        fStack_64 = fVar36 * (float)uVar12 - fVar35 * (float)uVar13;
        fStack_60 = (float)uVar13 * 0.0 - (float)uVar12 * 0.0;
        fStack_5c = (float)uVar13 * 0.0 - (float)uVar12 * 0.0;
        local_58 = ZEXT416((uint)(fVar35 * (float)uVar7 - fVar36 * (float)uVar6));
        uVar19 = 0;
        do {
          if ((pEmitter->pChannelAzimuths[uVar19] != 6.2831855) ||
             (NAN(pEmitter->pChannelAzimuths[uVar19]))) {
            local_48 = ZEXT416((uint)(pEmitter->OrientFront).x);
            fVar36 = pEmitter->ChannelRadius;
            fVar26 = (float)SDL_cosf();
            SDL_cosf();
            SDL_cosf();
            fVar35 = pEmitter->ChannelRadius;
            fVar27 = (float)SDL_sinf();
            SDL_sinf();
            SDL_sinf();
            SDL_cosf();
            fVar40 = (pEmitter->OrientFront).y;
            fVar1 = pEmitter->ChannelRadius;
            fVar36 = fVar36 * (float)local_48._0_4_;
            fVar28 = (float)SDL_cosf();
            SDL_cosf();
            SDL_sinf();
            fVar35 = fVar35 * local_68;
            fVar38 = pEmitter->ChannelRadius * fStack_64;
            fVar29 = (float)SDL_sinf();
            SDL_sinf();
            SDL_cosf();
            SDL_cosf();
            fVar25 = (pEmitter->OrientFront).z;
            fVar34 = pEmitter->ChannelRadius;
            fVar30 = (float)SDL_cosf();
            SDL_sinf();
            SDL_sinf();
            fVar31 = pEmitter->ChannelRadius * (float)local_58._0_4_;
            fVar32 = (float)SDL_sinf();
            channelPosition_00.x = (fVar27 * fVar35 + fVar26 * fVar36) - fVar33;
            channelPosition_00.y = (fVar29 * fVar38 + fVar28 * fVar1 * fVar40) - fVar37;
            channelPosition_00.z = (fVar31 * fVar32 + fVar25 * fVar34 * fVar30) - fVar39;
            ComputeEmitterChannelCoefficients
                      (local_110,&local_90,pEmitter->InnerRadius,channelPosition_00,local_12c,
                       local_118,Flags,(uint32_t)uVar19,pEmitter->ChannelCount,pMatrixCoefficients);
          }
          else {
            pMatrixCoefficients[(int)uVar22 * local_110->LFSpeakerIdx + (uint32_t)uVar19] =
                 local_118;
          }
          uVar19 = uVar19 + 1;
          uVar22 = (ulong)pEmitter->ChannelCount;
        } while (uVar19 < uVar22);
      }
    }
  }
  if ((Flags & 4) != 0) {
    pFVar20 = &F3DAudioCalculate::lpfDirectDefault;
    if (pEmitter->pLPFDirectCurve != (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      pFVar20 = pEmitter->pLPFDirectCurve;
    }
    pFVar15 = pFVar20->pPoints;
    uVar21 = (ulong)pFVar20->PointCount;
    uVar19 = 1;
    uVar22 = uVar19;
    if (1 < uVar21) {
      do {
        uVar22 = uVar19;
        if (fVar41 < pFVar15[uVar19].Distance) break;
        uVar19 = uVar19 + 1;
        uVar22 = uVar21;
      } while (uVar21 != uVar19);
    }
    if (uVar22 == uVar21) {
      fVar36 = pFVar15[pFVar20->PointCount - 1].DSPSetting;
    }
    else {
      fVar36 = (pFVar15[uVar22].Distance - fVar41) /
               (pFVar15[uVar22].Distance - pFVar15[uVar22 - 1].Distance);
      fVar36 = (1.0 - fVar36) * pFVar15[uVar22].DSPSetting + fVar36 * pFVar15[uVar22 - 1].DSPSetting
      ;
    }
    pDSPSettings->LPFDirectCoefficient = fVar36;
  }
  if ((Flags & 8) != 0) {
    pFVar20 = &F3DAudioCalculate::lpfReverbDefault;
    if (pEmitter->pLPFReverbCurve != (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      pFVar20 = pEmitter->pLPFReverbCurve;
    }
    pFVar15 = pFVar20->pPoints;
    uVar21 = (ulong)pFVar20->PointCount;
    uVar19 = 1;
    uVar22 = uVar19;
    if (1 < uVar21) {
      do {
        uVar22 = uVar19;
        if (fVar41 < pFVar15[uVar19].Distance) break;
        uVar19 = uVar19 + 1;
        uVar22 = uVar21;
      } while (uVar21 != uVar19);
    }
    if (uVar22 == uVar21) {
      fVar36 = pFVar15[pFVar20->PointCount - 1].DSPSetting;
    }
    else {
      fVar36 = (pFVar15[uVar22].Distance - fVar41) /
               (pFVar15[uVar22].Distance - pFVar15[uVar22 - 1].Distance);
      fVar36 = (1.0 - fVar36) * pFVar15[uVar22].DSPSetting + fVar36 * pFVar15[uVar22 - 1].DSPSetting
      ;
    }
    pDSPSettings->LPFReverbCoefficient = fVar36;
  }
  if ((Flags & 0x10) != 0) {
    pFVar20 = &F3DAudioCalculate::reverbDefault;
    if (pEmitter->pReverbCurve != (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      pFVar20 = pEmitter->pReverbCurve;
    }
    pFVar15 = pFVar20->pPoints;
    uVar21 = (ulong)pFVar20->PointCount;
    uVar19 = 1;
    uVar22 = uVar19;
    if (1 < uVar21) {
      do {
        uVar22 = uVar19;
        if (fVar41 < pFVar15[uVar19].Distance) break;
        uVar19 = uVar19 + 1;
        uVar22 = uVar21;
      } while (uVar21 != uVar19);
    }
    if (uVar22 == uVar21) {
      fVar41 = pFVar15[pFVar20->PointCount - 1].DSPSetting;
    }
    else {
      fVar41 = (pFVar15[uVar22].Distance - fVar41) /
               (pFVar15[uVar22].Distance - pFVar15[uVar22 - 1].Distance);
      fVar41 = (1.0 - fVar41) * pFVar15[uVar22].DSPSetting + fVar41 * pFVar15[uVar22 - 1].DSPSetting
      ;
    }
    pDSPSettings->ReverbLevel = fVar41;
  }
  if ((Flags & 0x20) != 0) {
    fVar41 = *(float *)(Instance + 0xc);
    pDSPSettings->DopplerFactor = 1.0;
    fVar36 = 0.0;
    if ((fVar24 != 0.0) || (NAN(fVar24))) {
      pDSPSettings->ListenerVelocityComponent =
           ((pListener->Velocity).z * fVar39 +
           (pListener->Velocity).x * fVar33 + (pListener->Velocity).y * fVar37) / fVar24;
      fVar36 = ((pEmitter->Velocity).z * fVar39 +
               (pEmitter->Velocity).x * fVar33 + (pEmitter->Velocity).y * fVar37) / fVar24;
    }
    else {
      pDSPSettings->ListenerVelocityComponent = 0.0;
    }
    pDSPSettings->EmitterVelocityComponent = fVar36;
    if (0.0 < pEmitter->DopplerScaler) {
      fVar40 = fVar41 / pEmitter->DopplerScaler;
      fVar35 = pDSPSettings->ListenerVelocityComponent;
      if (fVar40 <= pDSPSettings->ListenerVelocityComponent) {
        fVar35 = fVar40;
      }
      pDSPSettings->ListenerVelocityComponent = fVar35;
      if (fVar40 <= fVar36) {
        fVar36 = fVar40;
      }
      pDSPSettings->EmitterVelocityComponent = fVar36;
      fVar41 = (fVar41 - fVar35 * pEmitter->DopplerScaler) /
               (fVar41 - fVar36 * pEmitter->DopplerScaler);
      uVar23 = -(uint)NAN(fVar41);
      fVar36 = (float)(uVar23 & 0x3f800000 | ~uVar23 & (uint)fVar41);
      pDSPSettings->DopplerFactor = fVar36;
      fVar41 = 4.0;
      if ((fVar36 <= 4.0) && (fVar41 = 0.5, 0.5 <= fVar36)) {
        fVar41 = fVar36;
      }
      pDSPSettings->DopplerFactor = fVar41;
    }
  }
  if ((Flags & 0x40) != 0) {
    if (1.2e-07 <= fVar24) {
      fVar24 = (float)SDL_acosf((fVar39 * (pEmitter->OrientFront).z +
                                (pEmitter->OrientFront).x * fVar33 +
                                (pEmitter->OrientFront).y * fVar37) / fVar24);
    }
    else {
      fVar24 = 1.5707964;
    }
    pDSPSettings->EmitterToListenerAngle = fVar24;
  }
  if ((((Flags & 2) != 0) && (*(int *)Instance == 3)) && ((ulong)pDSPSettings->DstChannelCount != 0)
     ) {
    memset(pDSPSettings->pDelayTimes,0,(ulong)pDSPSettings->DstChannelCount << 2);
    return;
  }
  return;
}

Assistant:

void F3DAudioCalculate(
	const F3DAUDIO_HANDLE Instance,
	const F3DAUDIO_LISTENER *pListener,
	const F3DAUDIO_EMITTER *pEmitter,
	uint32_t Flags,
	F3DAUDIO_DSP_SETTINGS *pDSPSettings
) {
	uint32_t i;
	F3DAUDIO_VECTOR emitterToListener;
	float eToLDistance, normalizedDistance, dp;

	#define DEFAULT_POINTS(name, x1, y1, x2, y2) \
		static F3DAUDIO_DISTANCE_CURVE_POINT name##Points[2] = \
		{ \
			{ x1, y1 }, \
			{ x2, y2 } \
		}; \
		static F3DAUDIO_DISTANCE_CURVE name##Default = \
		{ \
			(F3DAUDIO_DISTANCE_CURVE_POINT*) &name##Points[0], 2 \
		};
	DEFAULT_POINTS(lpfDirect, 0.0f, 1.0f, 1.0f, 0.75f)
	DEFAULT_POINTS(lpfReverb, 0.0f, 0.75f, 1.0f, 0.75f)
	DEFAULT_POINTS(reverb, 0.0f, 1.0f, 1.0f, 0.0f)
	#undef DEFAULT_POINTS

	/* For XACT, this calculates "Distance" */
	emitterToListener = VectorSub(pListener->Position, pEmitter->Position);
	eToLDistance = VectorLength(emitterToListener);
	pDSPSettings->EmitterToListenerDistance = eToLDistance;

	F3DAudioCheckCalculateParams(Instance, pListener, pEmitter, Flags, pDSPSettings);

	/* This is used by MATRIX, LPF, and REVERB */
	normalizedDistance = eToLDistance / pEmitter->CurveDistanceScaler;

	if (Flags & F3DAUDIO_CALCULATE_MATRIX)
	{
		CalculateMatrix(
			SPEAKERMASK(Instance),
			Flags,
			pListener,
			pEmitter,
			pDSPSettings->SrcChannelCount,
			pDSPSettings->DstChannelCount,
			emitterToListener,
			eToLDistance,
			normalizedDistance,
			pDSPSettings->pMatrixCoefficients
		);
	}

	if (Flags & F3DAUDIO_CALCULATE_LPF_DIRECT)
	{
		pDSPSettings->LPFDirectCoefficient = ComputeDistanceAttenuation(
			normalizedDistance,
			(pEmitter->pLPFDirectCurve != NULL) ?
				pEmitter->pLPFDirectCurve :
				&lpfDirectDefault
		);
	}

	if (Flags & F3DAUDIO_CALCULATE_LPF_REVERB)
	{
		pDSPSettings->LPFReverbCoefficient = ComputeDistanceAttenuation(
			normalizedDistance,
			(pEmitter->pLPFReverbCurve != NULL) ?
				pEmitter->pLPFReverbCurve :
				&lpfReverbDefault
		);
	}

	if (Flags & F3DAUDIO_CALCULATE_REVERB)
	{
		pDSPSettings->ReverbLevel = ComputeDistanceAttenuation(
			normalizedDistance,
			(pEmitter->pReverbCurve != NULL) ?
				pEmitter->pReverbCurve :
				&reverbDefault
		);
	}

	/* For XACT, this calculates "DopplerPitchScalar" */
	if (Flags & F3DAUDIO_CALCULATE_DOPPLER)
	{
		CalculateDoppler(
			SPEEDOFSOUND(Instance),
			pListener,
			pEmitter,
			emitterToListener,
			eToLDistance,
			&pDSPSettings->ListenerVelocityComponent,
			&pDSPSettings->EmitterVelocityComponent,
			&pDSPSettings->DopplerFactor
		);
	}

	/* For XACT, this calculates "OrientationAngle" */
	if (Flags & F3DAUDIO_CALCULATE_EMITTER_ANGLE)
	{
		/* Determined roughly.
		 * Below that distance, the emitter angle is considered to be PI/2.
		 */
		#define EMITTER_ANGLE_NULL_DISTANCE 1.2e-7
		if (eToLDistance < EMITTER_ANGLE_NULL_DISTANCE)
		{
			pDSPSettings->EmitterToListenerAngle = F3DAUDIO_PI / 2.0f;
		}
		else
		{
			/* Note: pEmitter->OrientFront is normalized. */
			dp = VectorDot(emitterToListener, pEmitter->OrientFront) / eToLDistance;
			pDSPSettings->EmitterToListenerAngle = FAudio_acosf(dp);
		}
	}

	/* Unimplemented Flags */
	if (	(Flags & F3DAUDIO_CALCULATE_DELAY) &&
		SPEAKERMASK(Instance) == SPEAKER_STEREO	)
	{
		for (i = 0; i < pDSPSettings->DstChannelCount; i += 1)
		{
			pDSPSettings->pDelayTimes[i] = 0.0f;
		}
		FAudio_assert(0 && "DELAY not implemented!");
	}
}